

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::Canceler::AdapterImpl<void>::AdapterImpl
          (AdapterImpl<void> *this,PromiseFulfiller<void> *fulfiller,Canceler *canceler,
          Promise<void> *inner)

{
  SourceLocation location;
  SourceLocation location_00;
  SourceLocation local_88 [2];
  SourceLocation local_58;
  Canceler *local_40;
  Type local_38;
  Promise<void> local_30;
  Promise<void> *local_28;
  Promise<void> *inner_local;
  Canceler *canceler_local;
  PromiseFulfiller<void> *fulfiller_local;
  AdapterImpl<void> *this_local;
  
  local_28 = inner;
  inner_local = (Promise<void> *)canceler;
  canceler_local = (Canceler *)fulfiller;
  fulfiller_local = (PromiseFulfiller<void> *)this;
  AdapterBase::AdapterBase(&this->super_AdapterBase,canceler);
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_0059ec58;
  this->fulfiller = (PromiseFulfiller<void> *)canceler_local;
  local_38.fulfiller = (PromiseFulfiller<void> *)canceler_local;
  local_40 = canceler_local;
  SourceLocation::SourceLocation
            (&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,"AdapterImpl",0x110,0xd);
  location.function = local_58.function;
  location.fileName = local_58.fileName;
  location.lineNumber = local_58.lineNumber;
  location.columnNumber = local_58.columnNumber;
  Promise<void>::
  then<kj::Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__0,kj::Canceler::AdapterImpl<void>::__0(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__1>
            (&local_30,(Type *)inner,&local_38,location);
  SourceLocation::SourceLocation
            (local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,"AdapterImpl",0x110,0xd);
  location_00.function = local_88[0].function;
  location_00.fileName = local_88[0].fileName;
  location_00.lineNumber = local_88[0].lineNumber;
  location_00.columnNumber = local_88[0].columnNumber;
  Promise<void>::eagerlyEvaluate(&this->inner,&local_30,location_00);
  Promise<void>::~Promise(&local_30);
  return;
}

Assistant:

Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>& fulfiller,
            Canceler& canceler, kj::Promise<void> inner)
    : AdapterBase(canceler),
      fulfiller(fulfiller),
      inner(inner.then(
          [&fulfiller]() { fulfiller.fulfill(); },
          [&fulfiller](kj::Exception&& e) { fulfiller.reject(kj::mv(e)); })
          .eagerlyEvaluate(nullptr)) {}